

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O1

void onOpenComplete(void *context,IO_OPEN_RESULT open_result)

{
  int iVar1;
  STRING_HANDLE trace_log;
  BUFFER_HANDLE handle;
  size_t length;
  uchar *data;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                 ,"onOpenComplete",0x1d4,1,"Error: mqtt_client is NULL");
      return;
    }
  }
  else if ((open_result == IO_OPEN_OK) && ((*(ushort *)((long)context + 0xa0) & 2) == 0)) {
    *(undefined4 *)((long)context + 0x10) = 0x10;
    *(ushort *)((long)context + 0xa0) = *(ushort *)((long)context + 0xa0) | 2;
    if ((*(byte *)((long)context + 0xa2) & 1) == 0) {
      trace_log = (STRING_HANDLE)0x0;
    }
    else {
      trace_log = STRING_new();
    }
    handle = mqtt_codec_connect((MQTT_CLIENT_OPTIONS *)((long)context + 0x68),trace_log);
    if (handle == (BUFFER_HANDLE)0x0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                   ,"onOpenComplete",0x1ac,1,"Error: mqtt_codec_connect failed");
      }
    }
    else {
      length = BUFFER_length(handle);
      data = BUFFER_u_char(handle);
      iVar1 = sendPacketItem((MQTT_CLIENT *)context,data,length);
      if (iVar1 == 0) {
        log_outgoing_trace((MQTT_CLIENT *)context,trace_log);
      }
      else {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                     ,"onOpenComplete",0x1b4,1,"Error: failure sending connect packet");
        }
        if (*(code **)((long)context + 0x40) != (code *)0x0) {
          (**(code **)((long)context + 0x40))(context,1,*(undefined8 *)((long)context + 0x48));
        }
        *(byte *)((long)context + 0xa0) = *(byte *)((long)context + 0xa0) | 4;
      }
      BUFFER_delete(handle);
    }
    if (trace_log != (STRING_HANDLE)0x0) {
      STRING_delete(trace_log);
      return;
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                 ,"onOpenComplete",0x1ca,1,"Error: failure opening connection to endpoint");
    }
    if (((*(byte *)((long)context + 0xa0) & 2) == 0) &&
       (*(code **)((long)context + 0x40) != (code *)0x0)) {
      (**(code **)((long)context + 0x40))(context,1,*(undefined8 *)((long)context + 0x48));
    }
    *(byte *)((long)context + 0xa0) = *(byte *)((long)context + 0xa0) | 4;
  }
  return;
}

Assistant:

static void onOpenComplete(void* context, IO_OPEN_RESULT open_result)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)context;
    if (mqtt_client != NULL)
    {
        if (open_result == IO_OPEN_OK && !(mqtt_client->mqtt_status & MQTT_STATUS_SOCKET_CONNECTED))
        {
            mqtt_client->packetState = CONNECT_TYPE;
            mqtt_client->mqtt_status |= MQTT_STATUS_SOCKET_CONNECTED;

            STRING_HANDLE trace_log = construct_trace_log_handle(mqtt_client);

            // Send the Connect packet
            BUFFER_HANDLE connPacket = mqtt_codec_connect(&mqtt_client->mqttOptions, trace_log);
            if (connPacket == NULL)
            {
                LogError("Error: mqtt_codec_connect failed");
            }
            else
            {
                size_t size = BUFFER_length(connPacket);
                /*Codes_SRS_MQTT_CLIENT_07_009: [On success mqtt_client_connect shall send the MQTT CONNECT to the endpoint.]*/
                if (sendPacketItem(mqtt_client, BUFFER_u_char(connPacket), size) != 0)
                {
                    LogError("Error: failure sending connect packet");
                    // Set the status to pending close because we connot continue
                    // with CONN failing to send
                    if (mqtt_client->fnOnErrorCallBack)
                    {
                        mqtt_client->fnOnErrorCallBack(mqtt_client, MQTT_CLIENT_CONNECTION_ERROR, mqtt_client->errorCBCtx);
                    }
                    mqtt_client->mqtt_status |= MQTT_STATUS_PENDING_CLOSE;
                }
                else
                {
                    log_outgoing_trace(mqtt_client, trace_log);
                }
                BUFFER_delete(connPacket);
            }
            if (trace_log != NULL)
            {
                STRING_delete(trace_log);
            }
        }
        else
        {
            LogError("Error: failure opening connection to endpoint");
            if (!(mqtt_client->mqtt_status & MQTT_STATUS_SOCKET_CONNECTED) && mqtt_client->fnOnErrorCallBack)
            {
                mqtt_client->fnOnErrorCallBack(mqtt_client, MQTT_CLIENT_CONNECTION_ERROR, mqtt_client->errorCBCtx);
            }
            mqtt_client->mqtt_status |= MQTT_STATUS_PENDING_CLOSE;
        }
    }
    else
    {
        LogError("Error: mqtt_client is NULL");
    }
}